

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

bool Clasp::Cli::ClaspAppOptions::mappedOpts(ClaspAppOptions *this_,string *name,string *value)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  undefined1 *puVar5;
  char *pcVar6;
  char *in_RDX;
  long in_RDI;
  int i;
  int parsed;
  uint32 q [3];
  char *err;
  char *in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 in_stack_ffffffffffffffc3;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint (*out) [3];
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,
                                   CONCAT13(in_stack_ffffffffffffffc3,
                                            CONCAT12(in_stack_ffffffffffffffc2,
                                                     in_stack_ffffffffffffffc0))),
                          in_stack_ffffffffffffffb8);
  if (bVar1) {
    out = (uint (*) [3])0x0;
    iVar2 = 0xff;
    uVar8 = 0xff;
    uVar9 = 0xff;
    std::__cxx11::string::c_str();
    iVar2 = Potassco::xconvert<unsigned_int,3>(in_RDX,out,(char **)CONCAT44(uVar9,uVar8),iVar2);
    for (iVar7 = 0; iVar7 != iVar2; iVar7 = iVar7 + 1) {
      *(char *)(in_RDI + 0xae + (long)iVar7) =
           (char)*(undefined4 *)(&stack0xffffffffffffffcc + (long)iVar7 * 4);
    }
    if (iVar2 == 0) {
      return false;
    }
    return (char)(*out)[0] == '\0';
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,
                                   CONCAT13(in_stack_ffffffffffffffc3,
                                            CONCAT12(in_stack_ffffffffffffffc2,
                                                     in_stack_ffffffffffffffc0))),
                          in_stack_ffffffffffffffb8);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) || (uVar3 = std::__cxx11::string::size(), 2 < uVar3)) {
      return false;
    }
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 1) {
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDX);
      *(undefined1 *)(in_RDI + 0xac) = *puVar5;
      return true;
    }
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
    if (*pcVar6 == 't') {
      *(undefined1 *)(in_RDI + 0xac) = 9;
      return true;
    }
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
    if (*pcVar6 == 'n') {
      *(undefined1 *)(in_RDI + 0xac) = 10;
      return true;
    }
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
    if (*pcVar6 == 'v') {
      *(undefined1 *)(in_RDI + 0xac) = 0xb;
      return true;
    }
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
    if (*pcVar6 == '\\') {
      *(undefined1 *)(in_RDI + 0xac) = 0x5c;
      return true;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffc4,
                                     CONCAT13(in_stack_ffffffffffffffc3,
                                              CONCAT12(in_stack_ffffffffffffffc2,
                                                       in_stack_ffffffffffffffc0))),
                            in_stack_ffffffffffffffb8);
    if (bVar1) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcasecmp(pcVar6,"output");
      *(bool *)(in_RDI + 0xa8) = iVar2 == 0;
      if (iVar2 == 0) {
        return true;
      }
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcasecmp(pcVar6,"input");
      return iVar2 == 0;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffc4,
                                     CONCAT13(in_stack_ffffffffffffffc3,
                                              CONCAT12(in_stack_ffffffffffffffc2,
                                                       in_stack_ffffffffffffffc0))),
                            in_stack_ffffffffffffffb8);
    if (bVar1) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcasecmp(pcVar6,"aspif");
      if (iVar2 == 0) {
        *(undefined1 *)(in_RDI + 0xb1) = 1;
        return true;
      }
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcasecmp(pcVar6,"smodels");
      if (iVar2 == 0) {
        *(undefined1 *)(in_RDI + 0xb1) = 0xff;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ClaspAppOptions::mappedOpts(ClaspAppOptions* this_, const std::string& name, const std::string& value) {
	if (name == "quiet") {
		const char* err = 0;
		uint32      q[3]= {uint32(UCHAR_MAX),uint32(UCHAR_MAX),uint32(UCHAR_MAX)};
		int      parsed = Potassco::xconvert(value.c_str(), q, &err);
		for (int i = 0; i != parsed; ++i) { this_->quiet[i] = static_cast<uint8>(q[i]); }
		return parsed && *err == 0;
	}
	else if (name == "out-ifs") {
		if (value.empty() || value.size() > 2) { return false;}
		if (value.size() == 1) { this_->ifs = value[0]; return true; }
		if (value[1] == 't')   { this_->ifs = '\t'; return true; }
		if (value[1] == 'n')   { this_->ifs = '\n'; return true; }
		if (value[1] == 'v')   { this_->ifs = '\v'; return true; }
		if (value[1] == '\\')  { this_->ifs = '\\'; return true; }
	}
	else if (name == "lemma-out-dom") {
		return (this_->lemma.domOut = (strcasecmp(value.c_str(), "output") == 0)) == true || strcasecmp(value.c_str(), "input") == 0;
	}
	else if (name == "pre") {
		if      (strcasecmp(value.c_str(), "aspif")   == 0) { this_->onlyPre = (int8)AspParser::format_aspif; return true; }
		else if (strcasecmp(value.c_str(), "smodels") == 0) { this_->onlyPre = (int8)AspParser::format_smodels; return true; }
	}
	return false;
}